

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_unittest.cc
# Opt level: O0

void CheckStackTrace4(int i)

{
  void **ppvVar1;
  void **ppvVar2;
  _Check_string *unaff_retaddr;
  int local_10c;
  int j;
  LogMessage local_100;
  string *local_a0;
  _Check_string *_result_1;
  CheckOpString local_88;
  LogMessage local_80;
  string *local_20;
  _Check_string *_result;
  void *ra;
  int i_local;
  
  _result = unaff_retaddr;
  ra._4_4_ = i;
  ppvVar1 = google::GetReferenceableValue<void_const*>(&expected_range[2].start);
  ppvVar2 = google::GetReferenceableValue<void*>(&_result);
  local_20 = google::Check_LTImpl<void_const*,void*>
                       (ppvVar1,ppvVar2,"(&expected_range[2])->start < ra");
  if (local_20 != (string *)0x0) {
    google::CheckOpString::CheckOpString(&local_88,local_20);
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stacktrace_unittest.cc"
               ,0xab,&local_88);
    google::LogMessage::stream(&local_80);
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_80);
  }
  if (expected_range[2].end < _result) {
    printf("Adjusting range from %p..%p to %p..%p\n",expected_range[2].start,expected_range[2].end,
           expected_range[2].start,_result);
    expected_range[2].end = _result;
  }
  expected_range[1].start = (void *)0x10b9bd;
  expected_range[1].end = (void *)0x10b9e9;
  ppvVar1 = google::GetReferenceableValue<void_const*>(&expected_range[1].start);
  ppvVar2 = google::GetReferenceableValue<void_const*>(&expected_range[1].end);
  local_a0 = google::Check_LTImpl<void_const*,void_const*>
                       (ppvVar1,ppvVar2,"(&expected_range[1])->start < (&expected_range[1])->end");
  if (local_a0 != (string *)0x0) {
    google::CheckOpString::CheckOpString((CheckOpString *)&stack0xfffffffffffffef8,local_a0);
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_100,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stacktrace_unittest.cc"
               ,0xac,(CheckOpString *)&stack0xfffffffffffffef8);
    google::LogMessage::stream(&local_100);
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_100);
  }
  local_a0 = (string *)0x0;
  for (local_10c = ra._4_4_; -1 < local_10c; local_10c = local_10c + -1) {
    CheckStackTraceLeaf();
  }
  return;
}

Assistant:

static void ATTRIBUTE_NOINLINE CheckStackTrace4(int i) {
  ADJUST_ADDRESS_RANGE_FROM_RA(&expected_range[2]);
  INIT_ADDRESS_RANGE(CheckStackTrace4, start, end, &expected_range[1]);
  DECLARE_ADDRESS_LABEL(start);
  for (int j = i; j >= 0; j--) {
    CheckStackTraceLeaf();
  }
  DECLARE_ADDRESS_LABEL(end);
}